

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
::IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<2UL,_tuple<ParamIterator<unsigned_short>,_ParamIterator<unsigned_int>,_ParamIterator<ssl_test_ticket_aead_failure_mode>_>_>
  *this_00;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this_local;
  
  bVar1 = AtEnd(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!AtEnd()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                  ,0x361,
                  "virtual void testing::internal::CartesianProductGenerator<unsigned short, unsigned int, bssl::(anonymous namespace)::ssl_test_ticket_aead_failure_mode>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1, 2>>::Advance() [T = <unsigned short, unsigned int, bssl::(anonymous namespace)::ssl_test_ticket_aead_failure_mode>, I = std::integer_sequence<unsigned long, 0, 1, 2>]"
                 );
  }
  this_00 = std::
            get<2ul,testing::internal::ParamIterator<unsigned_short>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>>
                      (&this->current_);
  ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>::operator++(this_00)
  ;
  CartesianProductGenerator<unsigned_short,unsigned_int,bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
  ::IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul>>::AdvanceIfEnd<2ul>
            ((IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }